

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

QRect __thiscall
QtMWidgets::SliderPrivate::grooveHighlightedRect(SliderPrivate *this,QRect *sh,QRect *gr)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  QRect QVar8;
  
  cVar1 = QAbstractSlider::invertedAppearance();
  iVar2 = QAbstractSlider::orientation();
  if (cVar1 == '\0') {
    if (iVar2 == 2) {
      uVar6 = gr->y2;
      iVar2 = gr->x1;
      iVar3 = gr->y1;
      iVar7 = ~uVar6 + iVar3 + sh->y1 + this->radius;
      uVar4 = gr->x2;
      iVar5 = 0;
    }
    else {
      uVar4 = gr->x2;
      iVar2 = gr->x1;
      iVar3 = gr->y1;
      iVar5 = ~uVar4 + iVar2 + sh->x1 + this->radius;
      uVar6 = gr->y2;
      iVar7 = 0;
    }
    iVar7 = uVar6 + iVar7;
    iVar5 = uVar4 + iVar5;
  }
  else {
    if (iVar2 == 2) {
      iVar3 = this->radius + sh->y1;
      iVar2 = 0;
    }
    else {
      iVar2 = this->radius + sh->x1;
      iVar3 = 0;
    }
    iVar2 = iVar2 + gr->x1;
    iVar3 = iVar3 + gr->y1;
    iVar5 = gr->x2;
    iVar7 = gr->y2;
  }
  QVar8.y1 = iVar3;
  QVar8.x1 = iVar2;
  QVar8.y2 = iVar7;
  QVar8.x2 = iVar5;
  return QVar8;
}

Assistant:

QRect
SliderPrivate::grooveHighlightedRect( const QRect & sh, const QRect & gr ) const
{
	int grhw = 0, grhh = 0;

	QRect grh;

	if( !q->invertedAppearance() )
	{
		if( q->orientation() == Qt::Vertical )
			grhh = gr.height() - sh.y() - radius;
		else
			grhw = gr.width() - sh.x() - radius;

		grh = gr.marginsRemoved( QMargins( 0, 0, grhw, grhh ) );
	}
	else
	{
		if( q->orientation() == Qt::Vertical )
			grhh = sh.y() + radius;
		else
			grhw = sh.x() + radius;

		grh = gr.marginsRemoved( QMargins( grhw, grhh, 0, 0 ) );
	}

	return grh;
}